

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  QueryType QVar4;
  qpTestResult qVar5;
  TestContext *pTVar6;
  Context *pCVar7;
  int iVar8;
  GetBooleanVerifier *this_00;
  undefined4 extraout_var;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  GetInteger64Verifier *this_02;
  undefined4 extraout_var_01;
  StateVerifier *pSVar9;
  undefined4 extraout_var_02;
  TestContext *pTVar10;
  ApiCase *pAVar11;
  HintTestCase *pHVar12;
  StencilRefTestCase *pSVar13;
  StencilRefSeparateTestCase *pSVar14;
  StencilOpTestCase *pSVar15;
  TestNode *pTVar16;
  StencilFuncSeparateTestCase *pSVar17;
  StencilMaskTestCase *pSVar18;
  StencilMaskSeparateTestCase *pSVar19;
  StencilWriteMaskTestCase *pSVar20;
  StencilWriteMaskSeparateTestCase *pSVar21;
  PixelStoreAlignTestCase *pPVar22;
  BlendFuncTestCase *pBVar23;
  long lVar24;
  BlendEquationTestCase *pBVar25;
  BindingTest *pBVar26;
  char *pcVar27;
  undefined8 *puVar28;
  long lVar29;
  int _verifierNdx;
  GLenum in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  TestContext *local_b8;
  undefined8 uStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  long local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  StateVerifier *implementationLimitVerifiers [3];
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  iVar8 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  IntegerStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar8),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  iVar8 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  IntegerStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar8),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger = this_01;
  this_02 = (GetInteger64Verifier *)operator_new(0x28);
  iVar8 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  IntegerStateQueryVerifiers::GetInteger64Verifier::GetInteger64Verifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar8),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger64 = this_02;
  pSVar9 = (StateVerifier *)operator_new(0x28);
  iVar8 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  IntegerStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            ((GetFloatVerifier *)pSVar9,(Functions *)CONCAT44(extraout_var_02,iVar8),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = (GetFloatVerifier *)pSVar9;
  implementationLimitVerifiers[0] = &this->m_verifierBoolean->super_StateVerifier;
  implementationLimitVerifiers[1] = &this->m_verifierInteger64->super_StateVerifier;
  implementationLimitVerifiers[2] = pSVar9;
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x28) {
    local_b8 = pTVar10;
    for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
      pTVar6 = (TestContext *)implementationLimitVerifiers[lVar29];
      pAVar11 = (ApiCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,(&PTR_anon_var_dwarf_4e5eb1_00c1cf30)[(long)pTVar10 * 3],
                 (allocator<char> *)&local_100);
      std::operator+(&local_a8,&local_120,(char *)pTVar6->m_watchDog);
      pp_Var1 = (_func_int **)(&DAT_00c1cf40)[(long)pTVar10 * 3];
      ApiCase::ApiCase(pAVar11,pCVar7,local_a8._M_dataplus._M_p,
                       (&PTR_anon_var_dwarf_5299f7_00c1cf38)[(long)pTVar10 * 3]);
      (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00c1d710;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar6;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_120);
    }
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x2) {
    local_b8 = pTVar10;
    for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
      pTVar6 = (TestContext *)implementationLimitVerifiers[lVar29];
      pAVar11 = (ApiCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,(&PTR_anon_var_dwarf_114982_00c1d2f0)[(long)pTVar10 * 3],
                 (allocator<char> *)&local_100);
      std::operator+(&local_a8,&local_120,(char *)pTVar6->m_watchDog);
      pp_Var1 = (_func_int **)(&DAT_00c1d300)[(long)pTVar10 * 3];
      ApiCase::ApiCase(pAVar11,pCVar7,local_a8._M_dataplus._M_p,
                       (&PTR_anon_var_dwarf_529ee7_00c1d2f8)[(long)pTVar10 * 3]);
      (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00c1d768;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar6;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_120);
    }
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)this->m_verifierBoolean;
  local_a8._M_string_length = (size_type)this->m_verifierInteger;
  local_a8.field_2._M_allocated_capacity = (size_type)this->m_verifierInteger64;
  local_a8.field_2._8_8_ = this->m_verifierFloat;
  for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
    pSVar9 = implementationLimitVerifiers[lVar29];
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"sample_buffers",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"SAMPLE_BUFFERS");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1d7c0;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar9;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"samples",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"SAMPLES");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1d818;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pHVar12 = (HintTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"generate_mipmap_hint",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::HintTestCase::HintTestCase
              (pHVar12,pCVar7,pSVar9,local_120._M_dataplus._M_p,"GENERATE_MIPMAP_HINT",0x8192);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pHVar12);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pHVar12 = (HintTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"fragment_shader_derivative_hint",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::HintTestCase::HintTestCase
              (pHVar12,pCVar7,pSVar9,local_120._M_dataplus._M_p,"FRAGMENT_SHADER_DERIVATIVE_HINT",
               0x8b8b);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pHVar12);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"depth_func",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"DEPTH_FUNC");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1d8c8;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"cull_face_mode",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"CULL_FACE_MODE");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1d920;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"front_face_mode",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"FRONT_FACE");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1d978;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"viewport",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"VIEWPORT");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1d9d0;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"scissor_box",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"SCISSOR_BOX");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1da28;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"max_viewport_dims",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"MAX_VIEWPORT_DIMS");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1da80;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar13 = (StencilRefTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_ref",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar13,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_REF",0xb97);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar13 = (StencilRefTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_ref",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar13,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_REF",0x8ca3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar13);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar14 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_ref_separate",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    in_stack_fffffffffffffeb8 = 0x404;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar14,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_REF (separate)",0xb97,0x404
              );
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar14 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_ref_separate_both",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    in_stack_fffffffffffffeb8 = 0x408;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar14,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_REF (separate)",0xb97,0x408
              );
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar14 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_ref_separate",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    in_stack_fffffffffffffeb8 = 0x405;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar14,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_REF (separate)",0x8ca3
               ,0x405);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar14 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_ref_separate_both",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    in_stack_fffffffffffffeb8 = 0x408;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar14,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_REF (separate)",0x8ca3
               ,0x408);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x3) {
    puVar28 = &DAT_00c1d320 + (long)pTVar10 * 5;
    local_b8 = pTVar10;
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
      pSVar15 = (StencilOpTestCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"stencil_",(allocator<char> *)&local_78);
      std::operator+(&local_100,&local_d8,(char *)*puVar28);
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar15,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d328)[(long)pTVar10 * 5],(&DAT_00c1d330)[(long)pTVar10 * 10]);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
      pSVar15 = (StencilOpTestCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"stencil_back_",(allocator<char> *)&local_78);
      std::operator+(&local_100,&local_d8,(char *)*puVar28);
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar15,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d338)[(long)pTVar10 * 5],(&DAT_00c1d340)[(long)pTVar10 * 10]);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar15);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
      pTVar16 = (TestNode *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"stencil_",&local_d9);
      std::operator+(&local_d8,&local_78,(char *)*puVar28);
      std::operator+(&local_100,&local_d8,"_separate_both");
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      in_stack_fffffffffffffeb8 = 0x408;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar16,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d328)[(long)pTVar10 * 5],(&DAT_00c1d330)[(long)pTVar10 * 10],
                 0x408);
      tcu::TestNode::addChild((TestNode *)this,pTVar16);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
    }
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
      pTVar16 = (TestNode *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"stencil_back_",&local_d9);
      std::operator+(&local_d8,&local_78,(char *)*puVar28);
      std::operator+(&local_100,&local_d8,"_separate_both");
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      in_stack_fffffffffffffeb8 = 0x408;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar16,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d338)[(long)pTVar10 * 5],(&DAT_00c1d340)[(long)pTVar10 * 10],
                 0x408);
      tcu::TestNode::addChild((TestNode *)this,pTVar16);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
    }
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
      pTVar16 = (TestNode *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"stencil_",&local_d9);
      std::operator+(&local_d8,&local_78,(char *)*puVar28);
      std::operator+(&local_100,&local_d8,"_separate");
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      in_stack_fffffffffffffeb8 = 0x404;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar16,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d328)[(long)pTVar10 * 5],(&DAT_00c1d330)[(long)pTVar10 * 10],
                 0x404);
      tcu::TestNode::addChild((TestNode *)this,pTVar16);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
    }
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
      pTVar16 = (TestNode *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"stencil_back_",&local_d9);
      std::operator+(&local_d8,&local_78,(char *)*puVar28);
      std::operator+(&local_100,&local_d8,"_separate");
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      in_stack_fffffffffffffeb8 = 0x405;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar16,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d338)[(long)pTVar10 * 5],(&DAT_00c1d340)[(long)pTVar10 * 10],
                 0x405);
      tcu::TestNode::addChild((TestNode *)this,pTVar16);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
    }
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_func",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"STENCIL_FUNC");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1dc48;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar17 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_func_separate",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar17,pCVar7,pSVar9,local_120._M_dataplus._M_p,(char *)0xb92,0x404,
               in_stack_fffffffffffffeb8);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar17 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_func_separate_both",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar17,pCVar7,pSVar9,local_120._M_dataplus._M_p,(char *)0xb92,0x408,
               in_stack_fffffffffffffeb8);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar17 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_func_separate",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar17,pCVar7,pSVar9,local_120._M_dataplus._M_p,(char *)0x8800,0x405,
               in_stack_fffffffffffffeb8);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar17 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_func_separate_both",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar17,pCVar7,pSVar9,local_120._M_dataplus._M_p,(char *)0x8800,0x408,
               in_stack_fffffffffffffeb8);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar18 = (StencilMaskTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_value_mask",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar18,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_VALUE_MASK",0xb93);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar18 = (StencilMaskTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_value_mask",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar18,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_VALUE_MASK",0x8ca4);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar18);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar19 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_value_mask_separate",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar19,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_VALUE_MASK (separate)",
               0xb93,0x404);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar19 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_value_mask_separate_both",(allocator<char> *)&local_d8)
    ;
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar19,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_VALUE_MASK (separate)",
               0xb93,0x408);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar19 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_value_mask_separate",(allocator<char> *)&local_d8)
    ;
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar19,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_VALUE_MASK (separate)"
               ,0x8ca4,0x405);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar19 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_value_mask_separate_both",
               (allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar19,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_VALUE_MASK (separate)"
               ,0x8ca4,0x408);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar19);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar20 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_writemask",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar20,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_WRITEMASK",0xb98);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar20);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar20 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_writemask",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar20,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_WRITEMASK",0x8ca5);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar20);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar21 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_writemask_separate",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar21,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_WRITEMASK (separate)",0xb98
               ,0x404);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar21);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar21 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_writemask_separate_both",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar21,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_WRITEMASK (separate)",0xb98
               ,0x408);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar21);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar21 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_writemask_separate",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar21,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_WRITEMASK (separate)",
               0x8ca5,0x405);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar21);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pSVar21 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_back_writemask_separate_both",
               (allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar21,pCVar7,pSVar9,local_120._M_dataplus._M_p,"STENCIL_BACK_WRITEMASK (separate)",
               0x8ca5,0x408);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar21);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x8) {
    local_b8 = pTVar10;
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
      pAVar11 = (ApiCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,(&PTR_anon_var_dwarf_52a270_00c1d3a0)[(long)pTVar10 * 3],
                 (allocator<char> *)&local_d8);
      std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
      pTVar6 = (TestContext *)(&DAT_00c1d3b0)[(long)pTVar10 * 3];
      ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,
                       (char *)(&DAT_00c1d3a8)[(long)pTVar10 * 3]);
      (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00c1de58;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar6;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pPVar22 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"unpack_alignment",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar22,pCVar7,pSVar9,local_120._M_dataplus._M_p,"UNPACK_ALIGNMENT",0xcf5);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar22);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar29]._M_p;
    pPVar22 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"pack_alignment",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar22,pCVar7,pSVar9,local_120._M_dataplus._M_p,"PACK_ALIGNMENT",0xd05);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar22);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  lVar29 = 0;
  while (lVar29 != 4) {
    local_80 = lVar29;
    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar24]._M_p;
      pBVar23 = (BlendFuncTestCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,(&PTR_anon_var_dwarf_52a360_00c1d460)[lVar29 * 3],
                 (allocator<char> *)&local_d8);
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      anon_unknown_2::BlendFuncTestCase::BlendFuncTestCase
                (pBVar23,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d468)[lVar29 * 3],(&DAT_00c1d470)[lVar29 * 6],
                 (&DAT_00c1d474)[lVar29 * 6]);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar23);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    pTVar10 = (TestContext *)0x0;
    while (pTVar10 != (TestContext *)0x4) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[(long)pTVar10]._M_p;
      local_b8 = pTVar10;
      pBVar23 = (BlendFuncTestCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,(&PTR_anon_var_dwarf_52a360_00c1d460)[lVar29 * 3],
                 (allocator<char> *)&local_78);
      std::operator+(&local_100,&local_d8,"_separate");
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      anon_unknown_2::BlendFuncTestCase::BlendFuncTestCase
                (pBVar23,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d468)[lVar29 * 3],(&DAT_00c1d470)[lVar29 * 6],
                 (&DAT_00c1d474)[lVar29 * 6]);
      (pBVar23->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00c1df68;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar23);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
    }
    lVar29 = local_80 + 1;
  }
  lVar29 = 0;
  while (lVar29 != 2) {
    local_80 = lVar29;
    for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[lVar24]._M_p;
      pBVar25 = (BlendEquationTestCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,(&PTR_anon_var_dwarf_52a3c0_00c1d4c0)[lVar29 * 3],
                 (allocator<char> *)&local_d8);
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      anon_unknown_2::BlendEquationTestCase::BlendEquationTestCase
                (pBVar25,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d4c8)[lVar29 * 3],(&DAT_00c1d4d0)[lVar29 * 6],
                 (&DAT_00c1d4d4)[lVar29 * 6]);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar25);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    pTVar10 = (TestContext *)0x0;
    while (pTVar10 != (TestContext *)0x4) {
      pSVar9 = (StateVerifier *)(&local_a8._M_dataplus)[(long)pTVar10]._M_p;
      local_b8 = pTVar10;
      pBVar25 = (BlendEquationTestCase *)operator_new(0xa8);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,(&PTR_anon_var_dwarf_52a3c0_00c1d4c0)[lVar29 * 3],
                 (allocator<char> *)&local_78);
      std::operator+(&local_100,&local_d8,"_separate");
      std::operator+(&local_120,&local_100,pSVar9->m_testNamePostfix);
      anon_unknown_2::BlendEquationTestCase::BlendEquationTestCase
                (pBVar25,pCVar7,pSVar9,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d4c8)[lVar29 * 3],(&DAT_00c1d4d0)[lVar29 * 6],
                 (&DAT_00c1d4d4)[lVar29 * 6]);
      (pBVar25->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00c1e028;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar25);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
    }
    lVar29 = local_80 + 1;
  }
  for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
    lVar24 = 0;
    while (lVar24 != 4) {
      pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar24]._M_p;
      pAVar11 = (ApiCase *)operator_new(0xb0);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,(char *)(&DAT_00c1d4f0)[lVar29 * 4],
                 (allocator<char> *)&local_d8);
      std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
      local_b8 = (TestContext *)(&DAT_00c1d500)[lVar29 * 4];
      uStack_b0 = 0;
      uVar3 = (&DAT_00c1d508)[lVar29 * 8];
      local_80 = lVar24;
      ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,(char *)(&DAT_00c1d4f8)[lVar29 * 4]
                      );
      (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_00c1e088;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
      pAVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = local_b8;
      *(undefined4 *)
       &pAVar11[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = uVar3;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      lVar24 = local_80 + 1;
    }
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x7) {
    local_b8 = pTVar10;
    for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 4) {
      QVar4 = *(QueryType *)((long)init::queryTypes + lVar29);
      pBVar26 = (BindingTest *)operator_new(0x88);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,(char *)(&DAT_00c1d550)[(long)pTVar10 * 3],
                 (allocator<char> *)&local_d8);
      pcVar27 = anon_unknown_2::getQueryTypeSuffix(QVar4);
      std::operator+(&local_120,&local_100,pcVar27);
      uVar2 = (&DAT_00c1d560)[(long)pTVar10 * 3];
      anon_unknown_2::BindingTest::BindingTest
                (pBVar26,pCVar7,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d558)[(long)pTVar10 * 3],QVar4);
      (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00c1e0e0;
      *(undefined8 *)&pBVar26->field_0x7c = uVar2;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x10) {
    qVar5 = pTVar10[0x1a502].m_testResult;
    local_b8 = pTVar10;
    pBVar26 = (BindingTest *)operator_new(0x80);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"element_array_buffer_binding",(allocator<char> *)&local_d8);
    pcVar27 = anon_unknown_2::getQueryTypeSuffix(qVar5);
    std::operator+(&local_120,&local_100,pcVar27);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar26,pCVar7,local_120._M_dataplus._M_p,"GL_ELEMENT_ARRAY_BUFFER_BINDING",qVar5);
    (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c1e190;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 4);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x10) {
    qVar5 = pTVar10[0x1a502].m_testResult;
    local_b8 = pTVar10;
    pBVar26 = (BindingTest *)operator_new(0x80);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"transform_feedback_binding",(allocator<char> *)&local_d8);
    pcVar27 = anon_unknown_2::getQueryTypeSuffix(qVar5);
    std::operator+(&local_120,&local_100,pcVar27);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar26,pCVar7,local_120._M_dataplus._M_p,"GL_TRANSFORM_FEEDBACK_BINDING",qVar5);
    (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c1e1e8;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 4);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x10) {
    qVar5 = pTVar10[0x1a502].m_testResult;
    local_b8 = pTVar10;
    pBVar26 = (BindingTest *)operator_new(0x80);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"current_program_binding",(allocator<char> *)&local_d8);
    pcVar27 = anon_unknown_2::getQueryTypeSuffix(qVar5);
    std::operator+(&local_120,&local_100,pcVar27);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar26,pCVar7,local_120._M_dataplus._M_p,"CURRENT_PROGRAM",qVar5);
    (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c1e240;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 4);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x10) {
    qVar5 = pTVar10[0x1a502].m_testResult;
    local_b8 = pTVar10;
    pBVar26 = (BindingTest *)operator_new(0x80);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"vertex_array_binding",(allocator<char> *)&local_d8);
    pcVar27 = anon_unknown_2::getQueryTypeSuffix(qVar5);
    std::operator+(&local_120,&local_100,pcVar27);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar26,pCVar7,local_120._M_dataplus._M_p,"VERTEX_ARRAY_BINDING",qVar5);
    (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c1e298;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 4);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"stencil_clear_value",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"STENCIL_CLEAR_VALUE");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1e2f0;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"active_texture",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"ACTIVE_TEXTURE");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1e348;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x10) {
    qVar5 = pTVar10[0x1a502].m_testResult;
    local_b8 = pTVar10;
    pBVar26 = (BindingTest *)operator_new(0x80);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"renderbuffer_binding",(allocator<char> *)&local_d8);
    pcVar27 = anon_unknown_2::getQueryTypeSuffix(qVar5);
    std::operator+(&local_120,&local_100,pcVar27);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar26,pCVar7,local_120._M_dataplus._M_p,"RENDERBUFFER_BINDING",qVar5);
    (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c1e3a0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 4);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x10) {
    qVar5 = pTVar10[0x1a502].m_testResult;
    local_b8 = pTVar10;
    pBVar26 = (BindingTest *)operator_new(0x80);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"sampler_binding",(allocator<char> *)&local_d8);
    pcVar27 = anon_unknown_2::getQueryTypeSuffix(qVar5);
    std::operator+(&local_120,&local_100,pcVar27);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar26,pCVar7,local_120._M_dataplus._M_p,"SAMPLER_BINDING",qVar5);
    (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c1e3f8;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 4);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x4) {
    local_b8 = pTVar10;
    for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 4) {
      QVar4 = *(QueryType *)((long)init::queryTypes + lVar29);
      pBVar26 = (BindingTest *)operator_new(0x88);
      pCVar7 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,(&PTR_anon_var_dwarf_52a588_00c1d600)[(long)pTVar10 * 3],
                 (allocator<char> *)&local_d8);
      pcVar27 = anon_unknown_2::getQueryTypeSuffix(QVar4);
      std::operator+(&local_120,&local_100,pcVar27);
      uVar2 = (&DAT_00c1d610)[(long)pTVar10 * 3];
      anon_unknown_2::BindingTest::BindingTest
                (pBVar26,pCVar7,local_120._M_dataplus._M_p,
                 (char *)(&DAT_00c1d608)[(long)pTVar10 * 3],QVar4);
      (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_00c1e450;
      *(undefined8 *)&pBVar26->field_0x7c = uVar2;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 1);
  }
  pTVar10 = (TestContext *)0x0;
  while (pTVar10 != (TestContext *)0x10) {
    qVar5 = pTVar10[0x1a502].m_testResult;
    local_b8 = pTVar10;
    pBVar26 = (BindingTest *)operator_new(0x80);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"framebuffer_binding",(allocator<char> *)&local_d8);
    pcVar27 = anon_unknown_2::getQueryTypeSuffix(qVar5);
    std::operator+(&local_120,&local_100,pcVar27);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar26,pCVar7,local_120._M_dataplus._M_p,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING",qVar5);
    (pBVar26->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c1e4a8;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar26);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    pTVar10 = (TestContext *)((long)&local_b8->m_platform + 4);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"implementation_color_read",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,
                     "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1e500;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"read_buffer",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"READ_BUFFER");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1e558;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
    pp_Var1 = (_func_int **)(&local_a8._M_dataplus)[lVar29]._M_p;
    pAVar11 = (ApiCase *)operator_new(0xa0);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"draw_buffer",(allocator<char> *)&local_d8);
    std::operator+(&local_120,&local_100,(char *)pp_Var1[4]);
    ApiCase::ApiCase(pAVar11,pCVar7,local_120._M_dataplus._M_p,"DRAW_BUFFER");
    (pAVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_00c1e5b0;
    pAVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar11);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
  }
  return 4;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_INTEGER64,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",									"SUBPIXEL_BITS has minimum value of 4",										GL_SUBPIXEL_BITS,									4	},
		{ "max_3d_texture_size",							"MAX_3D_TEXTURE_SIZE has minimum value of 256",								GL_MAX_3D_TEXTURE_SIZE,								256	},
		{ "max_texture_size",								"MAX_TEXTURE_SIZE has minimum value of 2048",								GL_MAX_TEXTURE_SIZE,								2048},
		{ "max_array_texture_layers",						"MAX_ARRAY_TEXTURE_LAYERS has minimum value of 256",						GL_MAX_ARRAY_TEXTURE_LAYERS,						256	},
		{ "max_cube_map_texture_size",						"MAX_CUBE_MAP_TEXTURE_SIZE has minimum value of 2048",						GL_MAX_CUBE_MAP_TEXTURE_SIZE,						2048},
		{ "max_renderbuffer_size",							"MAX_RENDERBUFFER_SIZE has minimum value of 2048",							GL_MAX_RENDERBUFFER_SIZE,							2048},
		{ "max_draw_buffers",								"MAX_DRAW_BUFFERS has minimum value of 4",									GL_MAX_DRAW_BUFFERS,								4	},
		{ "max_color_attachments",							"MAX_COLOR_ATTACHMENTS has minimum value of 4",								GL_MAX_COLOR_ATTACHMENTS,							4	},
		{ "max_elements_indices",							"MAX_ELEMENTS_INDICES has minimum value of 0",								GL_MAX_ELEMENTS_INDICES,							0	},
		{ "max_elements_vertices",							"MAX_ELEMENTS_VERTICES has minimum value of 0",								GL_MAX_ELEMENTS_VERTICES,							0	},
		{ "num_extensions",									"NUM_EXTENSIONS has minimum value of 0",									GL_NUM_EXTENSIONS,									0	},
		{ "major_version",									"MAJOR_VERSION has minimum value of 3",										GL_MAJOR_VERSION,									3	},
		{ "minor_version",									"MINOR_VERSION has minimum value of 0",										GL_MINOR_VERSION,									0	},
		{ "max_vertex_attribs",								"MAX_VERTEX_ATTRIBS has minimum value of 16",								GL_MAX_VERTEX_ATTRIBS,								16	},
		{ "max_vertex_uniform_components",					"MAX_VERTEX_UNIFORM_COMPONENTS has minimum value of 1024",					GL_MAX_VERTEX_UNIFORM_COMPONENTS,					1024},
		{ "max_vertex_uniform_vectors",						"MAX_VERTEX_UNIFORM_VECTORS has minimum value of 256",						GL_MAX_VERTEX_UNIFORM_VECTORS,						256	},
		{ "max_vertex_uniform_blocks",						"MAX_VERTEX_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_VERTEX_UNIFORM_BLOCKS,						12	},
		{ "max_vertex_output_components",					"MAX_VERTEX_OUTPUT_COMPONENTS has minimum value of 64",						GL_MAX_VERTEX_OUTPUT_COMPONENTS,					64	},
		{ "max_vertex_texture_image_units",					"MAX_VERTEX_TEXTURE_IMAGE_UNITS has minimum value of 16",					GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,					16	},
		{ "max_fragment_uniform_components",				"MAX_FRAGMENT_UNIFORM_COMPONENTS has minimum value of 896",					GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,					896	},
		{ "max_fragment_uniform_vectors",					"MAX_FRAGMENT_UNIFORM_VECTORS has minimum value of 224",					GL_MAX_FRAGMENT_UNIFORM_VECTORS,					224	},
		{ "max_fragment_uniform_blocks",					"MAX_FRAGMENT_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_FRAGMENT_UNIFORM_BLOCKS,						12	},
		{ "max_fragment_input_components",					"MAX_FRAGMENT_INPUT_COMPONENTS has minimum value of 60",					GL_MAX_FRAGMENT_INPUT_COMPONENTS,					60	},
		{ "max_texture_image_units",						"MAX_TEXTURE_IMAGE_UNITS has minimum value of 16",							GL_MAX_TEXTURE_IMAGE_UNITS,							16	},
		{ "max_program_texel_offset",						"MAX_PROGRAM_TEXEL_OFFSET has minimum value of 7",							GL_MAX_PROGRAM_TEXEL_OFFSET,						7	},
		{ "max_uniform_buffer_bindings",					"MAX_UNIFORM_BUFFER_BINDINGS has minimum value of 24",						GL_MAX_UNIFORM_BUFFER_BINDINGS,						24	},
		{ "max_combined_uniform_blocks",					"MAX_COMBINED_UNIFORM_BLOCKS has minimum value of 24",						GL_MAX_COMBINED_UNIFORM_BLOCKS,						24	},
		{ "max_varying_components",							"MAX_VARYING_COMPONENTS has minimum value of 60",							GL_MAX_VARYING_COMPONENTS,							60	},
		{ "max_varying_vectors",							"MAX_VARYING_VECTORS has minimum value of 15",								GL_MAX_VARYING_VECTORS,								15	},
		{ "max_combined_texture_image_units",				"MAX_COMBINED_TEXTURE_IMAGE_UNITS has minimum value of 32",					GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,				32	},
		{ "max_transform_feedback_interleaved_components",	"MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS has minimum value of 64",	GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,	64	},
		{ "max_transform_feedback_separate_attribs",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS has minimum value of 4",			GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS,			4	},
		{ "max_transform_feedback_separate_components",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS has minimum value of 4",		GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS,		4	},
		{ "max_samples",									"MAX_SAMPLES has minimum value of 4",										GL_MAX_SAMPLES,										4	},
		{ "red_bits",										"RED_BITS has minimum value of 0",											GL_RED_BITS,										0	},
		{ "green_bits",										"GREEN_BITS has minimum value of 0",										GL_GREEN_BITS,										0	},
		{ "blue_bits",										"BLUE_BITS has minimum value of 0",											GL_BLUE_BITS,										0	},
		{ "alpha_bits",										"ALPHA_BITS has minimum value of 0",										GL_ALPHA_BITS,										0	},
		{ "depth_bits",										"DEPTH_BITS has minimum value of 0",										GL_DEPTH_BITS,										0	},
		{ "stencil_bits",									"STENCIL_BITS has minimum value of 0",										GL_STENCIL_BITS,									0	},
	};
	const LimitedStateInteger implementationMaxLimits[] =
	{
		{ "min_program_texel_offset",						"MIN_PROGRAM_TEXEL_OFFSET has maximum value of -8",							GL_MIN_PROGRAM_TEXEL_OFFSET,						-8	},
		{ "uniform_buffer_offset_alignment",				"UNIFORM_BUFFER_OFFSET_ALIGNMENT has minimum value of 1",					GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT,					256	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean, int64 and float
	StateVerifier* implementationLimitVerifiers[] = {m_verifierBoolean, m_verifierInteger64, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMaxLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMaximumValueTestCase(m_context, verifier, (std::string(implementationMaxLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMaxLimits[testNdx].description, implementationMaxLimits[testNdx].targetName, implementationMaxLimits[testNdx].value)));

	StateVerifier* normalVerifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("fragment_shader_derivative_hint")		+ verifier->getTestNamePostfix()).c_str(),		"FRAGMENT_SHADER_DERIVATIVE_HINT",	GL_FRAGMENT_SHADER_DERIVATIVE_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	const struct PixelStoreState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} pixelStoreStates[] =
	{
		{ "unpack_image_height","UNPACK_IMAGE_HEIGHT",	GL_UNPACK_IMAGE_HEIGHT,	0 },
		{ "unpack_skip_images",	"UNPACK_SKIP_IMAGES",	GL_UNPACK_SKIP_IMAGES,	0 },
		{ "unpack_row_length",	"UNPACK_ROW_LENGTH",	GL_UNPACK_ROW_LENGTH,	0 },
		{ "unpack_skip_rows",	"UNPACK_SKIP_ROWS",		GL_UNPACK_SKIP_ROWS,	0 },
		{ "unpack_skip_pixels",	"UNPACK_SKIP_PIXELS",	GL_UNPACK_SKIP_PIXELS,	0 },
		{ "pack_row_length",	"PACK_ROW_LENGTH",		GL_PACK_ROW_LENGTH,		0 },
		{ "pack_skip_rows",		"PACK_SKIP_ROWS",		GL_PACK_SKIP_ROWS,		0 },
		{ "pack_skip_pixels",	"PACK_SKIP_PIXELS",		GL_PACK_SKIP_PIXELS,	0 }
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(pixelStoreStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreTestCase(m_context, verifier, (std::string(pixelStoreStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), pixelStoreStates[testNdx].description, pixelStoreStates[testNdx].target, pixelStoreStates[testNdx].initialValue)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	const struct BlendColorState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendColorStates[] =
	{
		{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
		{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
		{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
		{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
	}

	const struct BlendEquationState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendEquationStates[] =
	{
		{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
		{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
	}

	const struct ImplementationArrayReturningState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		targetLengthTarget;
		int			minLength;
	} implementationArrayReturningStates[] =
	{
		{ "compressed_texture_formats",		"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,	GL_NUM_COMPRESSED_TEXTURE_FORMATS,	10	},
		{ "program_binary_formats",			"PROGRAM_BINARY_FORMATS",		GL_PROGRAM_BINARY_FORMATS,		GL_NUM_PROGRAM_BINARY_FORMATS,		0	},
		{ "shader_binary_formats",			"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,		GL_NUM_SHADER_BINARY_FORMATS,		0	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationArrayReturningStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase(m_context, verifier, (std::string(implementationArrayReturningStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationArrayReturningStates[testNdx].description,	implementationArrayReturningStates[testNdx].target,	implementationArrayReturningStates[testNdx].targetLengthTarget,	implementationArrayReturningStates[testNdx].minLength)));
	}

	const struct BufferBindingState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} bufferBindingStates[] =
	{
		{ "array_buffer_binding",				"ARRAY_BUFFER_BINDING",					GL_ARRAY_BUFFER_BINDING,				GL_ARRAY_BUFFER				},
		{ "uniform_buffer_binding",				"UNIFORM_BUFFER_BINDING",				GL_UNIFORM_BUFFER_BINDING,				GL_UNIFORM_BUFFER			},
		{ "pixel_pack_buffer_binding",			"PIXEL_PACK_BUFFER_BINDING",			GL_PIXEL_PACK_BUFFER_BINDING,			GL_PIXEL_PACK_BUFFER		},
		{ "pixel_unpack_buffer_binding",		"PIXEL_UNPACK_BUFFER_BINDING",			GL_PIXEL_UNPACK_BUFFER_BINDING,			GL_PIXEL_UNPACK_BUFFER		},
		{ "transform_feedback_buffer_binding",	"TRANSFORM_FEEDBACK_BUFFER_BINDING",	GL_TRANSFORM_FEEDBACK_BUFFER_BINDING,	GL_TRANSFORM_FEEDBACK_BUFFER},
		{ "copy_read_buffer_binding",			"COPY_READ_BUFFER_BINDING",				GL_COPY_READ_BUFFER_BINDING,			GL_COPY_READ_BUFFER			},
		{ "copy_write_buffer_binding",			"COPY_WRITE_BUFFER_BINDING",			GL_COPY_WRITE_BUFFER_BINDING,			GL_COPY_WRITE_BUFFER		}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(bufferBindingStates); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new BufferBindingTestCase(m_context, queryType, (std::string(bufferBindingStates[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), bufferBindingStates[testNdx].description, bufferBindingStates[testNdx].target, bufferBindingStates[testNdx].type)));
	}

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new ElementArrayBufferBindingTestCase	(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TransformFeedbackBindingTestCase	(m_context, queryType, (std::string("transform_feedback_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new VertexArrayBindingTestCase			(m_context, queryType, (std::string("vertex_array_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"VERTEX_ARRAY_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new SamplerObjectBindingTestCase		(m_context, queryType, (std::string("sampler_binding")				+ getQueryTypeSuffix(queryType)).c_str(),	"SAMPLER_BINDING")));

	const struct TextureBinding
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} textureBindings[] =
	{
		{ "texture_binding_2d",			"TEXTURE_BINDING_2D",		GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D		},
		{ "texture_binding_3d",			"TEXTURE_BINDING_3D",		GL_TEXTURE_BINDING_3D,			GL_TEXTURE_3D		},
		{ "texture_binding_2d_array",	"TEXTURE_BINDING_2D_ARRAY",	GL_TEXTURE_BINDING_2D_ARRAY,	GL_TEXTURE_2D_ARRAY	},
		{ "texture_binding_cube_map",	"TEXTURE_BINDING_CUBE_MAP",	GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(textureBindings); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new TextureBindingTestCase(m_context, queryType, (std::string(textureBindings[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), textureBindings[testNdx].description, textureBindings[testNdx].target, textureBindings[testNdx].type)));
	}


	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase		(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase	(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ReadBufferCase					(m_context, verifier, (std::string("read_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"READ_BUFFER")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DrawBufferCase					(m_context, verifier, (std::string("draw_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"DRAW_BUFFER")));
}